

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

float average_diff(vw *all,float *oldgamma,float *newgamma)

{
  float *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar1;
  float fVar2;
  float normalizer;
  float sum;
  
  fVar1 = std::
          inner_product<float*,float*,float,average_diff(vw&,float*,float*)::_lambda(float,float)_1_,average_diff(vw&,float*,float*)::_lambda(float,float)_2_>
                    (in_RSI,in_RSI + (ulong)*(uint *)(in_RDI + 0x3478) * 4,in_RDX);
  fVar2 = std::accumulate<float*,float>(in_RDX,in_RDX + *(uint *)(in_RDI + 0x3478),0.0);
  return fVar1 / fVar2;
}

Assistant:

static inline float average_diff(vw &all, float *oldgamma, float *newgamma)
{
  float sum;
  float normalizer;

  // This warps the normal sense of "inner product", but it accomplishes the same
  // thing as the "plain old" for loop. clang does a good job of reducing the
  // common subexpressions.
  sum = std::inner_product(oldgamma, oldgamma + all.lda, newgamma, 0.0f,
      [](float accum, float absdiff) { return accum + absdiff; },
      [](float old_g, float new_g) { return std::abs(old_g - new_g); });

  normalizer = std::accumulate(newgamma, newgamma + all.lda, 0.0f);
  return sum / normalizer;
}